

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

void boost::unordered::detail::foa::
     table_arrays<const_slang::ast::Symbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<const_slang::ast::Symbol_*>_>
     ::delete_(undefined8 param_1,long param_2)

{
  value_type *ppSVar1;
  allocator_type sal;
  allocator<const_slang::ast::Symbol_*> *in_stack_ffffffffffffffd8;
  allocator<const_slang::ast::Symbol_*> *in_stack_ffffffffffffffe0;
  pointer __p;
  allocator_type *in_stack_ffffffffffffffe8;
  
  std::allocator<const_slang::ast::Symbol_*>::allocator
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  ppSVar1 = elements((table_arrays<const_slang::ast::Symbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<const_slang::ast::Symbol_*>_>
                      *)0x9db7d8);
  if (ppSVar1 != (value_type *)0x0) {
    __p = *(pointer *)(param_2 + 0x18);
    buffer_size(*(long *)(param_2 + 8) + 1);
    std::allocator_traits<std::allocator<const_slang::ast::Symbol_*>_>::deallocate
              (in_stack_ffffffffffffffe8,__p,(size_type)in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

static void delete_(allocator_type al, table_arrays& arrays) noexcept {
        using storage_traits = std::allocator_traits<allocator_type>;

        auto sal = allocator_type(al);
        if (arrays.elements()) {
            storage_traits::deallocate(sal, arrays.elements_,
                                       buffer_size(arrays.groups_size_mask + 1));
        }
    }